

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetShaderResourceTypeLiteralName
                 (SHADER_RESOURCE_TYPE ResourceType,bool bGetFullName)

{
  Char *Message;
  char (*in_R8) [2];
  uint local_3c;
  undefined1 local_38 [8];
  string msg;
  bool bGetFullName_local;
  char *pcStack_10;
  SHADER_RESOURCE_TYPE ResourceType_local;
  
  switch(ResourceType) {
  case SHADER_RESOURCE_TYPE_UNKNOWN:
    pcStack_10 = "unknown";
    if (bGetFullName) {
      pcStack_10 = "SHADER_RESOURCE_TYPE_UNKNOWN";
    }
    break;
  case SHADER_RESOURCE_TYPE_CONSTANT_BUFFER:
    pcStack_10 = "constant buffer";
    if (bGetFullName) {
      pcStack_10 = "SHADER_RESOURCE_TYPE_CONSTANT_BUFFER";
    }
    break;
  case SHADER_RESOURCE_TYPE_TEXTURE_SRV:
    pcStack_10 = "texture SRV";
    if (bGetFullName) {
      pcStack_10 = "SHADER_RESOURCE_TYPE_TEXTURE_SRV";
    }
    break;
  case SHADER_RESOURCE_TYPE_BUFFER_SRV:
    pcStack_10 = "buffer SRV";
    if (bGetFullName) {
      pcStack_10 = "SHADER_RESOURCE_TYPE_BUFFER_SRV";
    }
    break;
  case SHADER_RESOURCE_TYPE_TEXTURE_UAV:
    pcStack_10 = "texture UAV";
    if (bGetFullName) {
      pcStack_10 = "SHADER_RESOURCE_TYPE_TEXTURE_UAV";
    }
    break;
  case SHADER_RESOURCE_TYPE_BUFFER_UAV:
    pcStack_10 = "buffer UAV";
    if (bGetFullName) {
      pcStack_10 = "SHADER_RESOURCE_TYPE_BUFFER_UAV";
    }
    break;
  case SHADER_RESOURCE_TYPE_SAMPLER:
    pcStack_10 = "sampler";
    if (bGetFullName) {
      pcStack_10 = "SHADER_RESOURCE_TYPE_SAMPLER";
    }
    break;
  case SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT:
    pcStack_10 = "input attachment";
    if (bGetFullName) {
      pcStack_10 = "SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT";
    }
    break;
  case SHADER_RESOURCE_TYPE_ACCEL_STRUCT:
    pcStack_10 = "acceleration structure";
    if (bGetFullName) {
      pcStack_10 = "SHADER_RESOURCE_TYPE_ACCEL_STRUCT";
    }
    break;
  default:
    local_3c = (uint)ResourceType;
    msg.field_2._M_local_buf[0xe] = bGetFullName;
    msg.field_2._M_local_buf[0xf] = ResourceType;
    FormatString<char[27],unsigned_int,char[2]>
              ((string *)local_38,(Diligent *)"Unexpected resource type (",(char (*) [27])&local_3c,
               (uint *)0xf65f2d,in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetShaderResourceTypeLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x370);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const Char* GetShaderResourceTypeLiteralName(SHADER_RESOURCE_TYPE ResourceType, bool bGetFullName)
{
    static_assert(SHADER_RESOURCE_TYPE_LAST == 8, "Please update the switch below to handle the new shader resource type");
    switch (ResourceType)
    {
        // clang-format off
        case SHADER_RESOURCE_TYPE_UNKNOWN:          return bGetFullName ?  "SHADER_RESOURCE_TYPE_UNKNOWN"          : "unknown";
        case SHADER_RESOURCE_TYPE_CONSTANT_BUFFER:  return bGetFullName ?  "SHADER_RESOURCE_TYPE_CONSTANT_BUFFER"  : "constant buffer";
        case SHADER_RESOURCE_TYPE_TEXTURE_SRV:      return bGetFullName ?  "SHADER_RESOURCE_TYPE_TEXTURE_SRV"      : "texture SRV";
        case SHADER_RESOURCE_TYPE_BUFFER_SRV:       return bGetFullName ?  "SHADER_RESOURCE_TYPE_BUFFER_SRV"       : "buffer SRV";
        case SHADER_RESOURCE_TYPE_TEXTURE_UAV:      return bGetFullName ?  "SHADER_RESOURCE_TYPE_TEXTURE_UAV"      : "texture UAV";
        case SHADER_RESOURCE_TYPE_BUFFER_UAV:       return bGetFullName ?  "SHADER_RESOURCE_TYPE_BUFFER_UAV"       : "buffer UAV";
        case SHADER_RESOURCE_TYPE_SAMPLER:          return bGetFullName ?  "SHADER_RESOURCE_TYPE_SAMPLER"          : "sampler";
        case SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT: return bGetFullName ?  "SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT" : "input attachment";
        case SHADER_RESOURCE_TYPE_ACCEL_STRUCT:     return bGetFullName ?  "SHADER_RESOURCE_TYPE_ACCEL_STRUCT"     : "acceleration structure";
        // clang-format on
        default:
            UNEXPECTED("Unexpected resource type (", Uint32{ResourceType}, ")");
            return "UNKNOWN";
    }
}